

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall helics::apps::Connector::loadTextFile(Connector *this,string *filename)

{
  byte bVar1;
  byte *pbVar2;
  pointer __dest;
  string_view quoteChars;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  pointer pcVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq;
  App *this_00;
  double dVar8;
  undefined1 auVar9 [16];
  string_view line;
  stringVector blk;
  vector<int,_std::allocator<int>_> cnts;
  int lineNumber;
  string str;
  AppTextParser aparser;
  delimiter_compression in_stack_fffffffffffffbb8;
  undefined1 local_440 [40];
  size_type local_418;
  int local_40c;
  string local_408 [3];
  ios_base local_390 [264];
  undefined1 local_288 [528];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  AppTextParser::AppTextParser((AppTextParser *)local_288,filename);
  local_408[0]._M_dataplus._M_p = (pointer)0x0;
  local_408[0]._M_string_length = 0;
  local_408[0].field_2._M_allocated_capacity = 0;
  AppTextParser::preParseFile
            ((vector<int,_std::allocator<int>_> *)(local_440 + 0x18),(AppTextParser *)local_288,
             (vector<char,_std::allocator<char>_> *)local_408);
  if (local_408[0]._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_408[0]._M_dataplus._M_p,
                    local_408[0].field_2._M_allocated_capacity - (long)local_408[0]._M_dataplus._M_p
                   );
  }
  AppTextParser::reset((AppTextParser *)local_288);
  if (local_70 != 0) {
    apps::App::loadConfigOptions(&this->super_App,(AppTextParser *)local_288);
    generateParser((Connector *)local_440);
    std::__cxx11::istringstream::istringstream((istringstream *)local_408,(string *)&local_78,_S_in)
    ;
    uVar3 = local_440._0_8_;
    if (*(uint32_t *)(local_440._0_8_ + 0x2e4) == 0) {
      CLI::App::_validate((App *)local_440._0_8_);
      CLI::App::_configure((App *)uVar3);
    }
    CLI::App::_parse_stream((App *)uVar3,(istream *)local_408);
    CLI::App::run_callback((App *)uVar3,false,false);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_408);
    std::ios_base::~ios_base(local_390);
    if ((App *)local_440._0_8_ != (App *)0x0) {
      (**(code **)(((_Alloc_hider *)local_440._0_8_)->_M_p + 8))();
    }
  }
  lVar5 = (long)*(int *)local_440._24_8_ + (this->connections)._M_h._M_element_count;
  auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar9._0_8_ = lVar5;
  auVar9._12_4_ = 0x45300000;
  dVar8 = ceil(((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
               (double)(this->connections)._M_h._M_rehash_policy._M_max_load_factor);
  CLI::std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::rehash(&(this->connections)._M_h,
           (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8);
  local_408[0]._M_dataplus._M_p = (pointer)&local_408[0].field_2;
  local_408[0]._M_string_length = 0;
  local_408[0].field_2._M_allocated_capacity =
       local_408[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
  while( true ) {
    bVar4 = AppTextParser::loadNextLine((AppTextParser *)local_288,local_408,&local_40c);
    if (!bVar4) break;
    quoteChars._M_str = (char *)0x3d5e4f;
    quoteChars._M_len = 3;
    line._M_str = (char *)0x3;
    line._M_len = (size_t)local_408[0]._M_dataplus._M_p;
    gmlc::utilities::stringOps::splitlineQuotes_abi_cxx11_
              ((stringVector *)local_440,(stringOps *)local_408[0]._M_string_length,line,
               (string_view)ZEXT816(0x3d5d55),quoteChars,in_stack_fffffffffffffbb8);
    uVar3 = local_440._8_8_;
    for (this_00 = (App *)local_440._0_8_; this_00 != (App *)uVar3;
        this_00 = (App *)((this_00->name_).field_2._M_local_buf + 8)) {
      pcVar6 = (this_00->name_)._M_dataplus._M_p;
      if ((pointer)0x1 < pcVar6) {
        pbVar2 = (byte *)((_Alloc_hider *)&this_00->_vptr_App)->_M_p;
        bVar1 = *pbVar2;
        uVar7 = bVar1 - 0x22;
        if (((uVar7 < 0x3f) && ((0x4000000000000021U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) &&
           (bVar1 == pbVar2[(long)(pcVar6 + -1)])) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
          pcVar6 = (this_00->name_)._M_dataplus._M_p;
          if (pcVar6 == (pointer)0x1) {
            pcVar6 = ((_Alloc_hider *)&this_00->_vptr_App)->_M_p;
            (this_00->name_)._M_dataplus._M_p = (pointer)0x0;
          }
          else {
            pcVar6 = pcVar6 + -1;
            __dest = ((_Alloc_hider *)&this_00->_vptr_App)->_M_p;
            if (pcVar6 == (pointer)0x1) {
              *__dest = __dest[1];
            }
            else {
              memmove(__dest,__dest + 1,(size_t)pcVar6);
            }
            pcVar6 = (this_00->name_)._M_dataplus._M_p + -1;
            (this_00->name_)._M_dataplus._M_p = pcVar6;
            pcVar6 = pcVar6 + (long)((_Alloc_hider *)&this_00->_vptr_App)->_M_p;
          }
          *pcVar6 = '\0';
        }
      }
    }
    addConnectionVector(this,(stringVector *)local_440);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((stringVector *)local_440);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408[0]._M_dataplus._M_p != &local_408[0].field_2) {
    operator_delete(local_408[0]._M_dataplus._M_p,local_408[0].field_2._M_allocated_capacity + 1);
  }
  if ((int *)local_440._24_8_ != (int *)0x0) {
    operator_delete((void *)local_440._24_8_,local_418 - local_440._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_288 + 8);
  return;
}

Assistant:

void Connector::loadTextFile(const std::string& filename)
{
    using namespace gmlc::utilities::stringOps;  // NOLINT
    AppTextParser aparser(filename);
    auto cnts = aparser.preParseFile({});

    aparser.reset();

    if (!aparser.configString().empty()) {
        App::loadConfigOptions(aparser);
        auto app = generateParser();
        std::istringstream sstr(aparser.configString());
        app->parse_from_stream(sstr);
    }
    connections.reserve(connections.size() + cnts[0]);
    std::string str;
    int lineNumber;
    while (aparser.loadNextLine(str, lineNumber)) {
        /* time key type value units*/
        auto blk = splitlineQuotes(str, ",\t ", default_quote_chars, delimiter_compression::on);
        for (auto& seq : blk) {
            CLI::detail::remove_quotes(seq);
        }
        addConnectionVector(blk);
    }
}